

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-feeder-c-impl.h
# Opt level: O0

void __thiscall
mp::NLW2_NLFeeder_C_Impl::FeedRowAndObjNames<mp::StringFileWriter>
          (NLW2_NLFeeder_C_Impl *this,StringFileWriter *wrt)

{
  bool bVar1;
  NLW2_NLFeeder_C *pNVar2;
  function<void_(const_char_*)> *in_RDI;
  function<void_(const_char_*)> wrt_c;
  StringFileWriter *in_stack_ffffffffffffffa0;
  undefined1 *puVar3;
  anon_class_8_1_ba1d8859 *in_stack_ffffffffffffffa8;
  _func_void_void_ptr_void_ptr *p_Var4;
  undefined1 local_30 [48];
  
  pNVar2 = NLF((NLW2_NLFeeder_C_Impl *)in_RDI);
  if ((pNVar2->want_row_and_obj_names_ != 0) &&
     (bVar1 = StringFileWriter::operator_cast_to_bool(in_stack_ffffffffffffffa0), bVar1)) {
    puVar3 = local_30;
    std::function<void(char_const*)>::
    function<mp::NLW2_NLFeeder_C_Impl::FeedRowAndObjNames<mp::StringFileWriter>(mp::StringFileWriter&)::_lambda(char_const*)_1_,void>
              (in_RDI,in_stack_ffffffffffffffa8);
    pNVar2 = NLF((NLW2_NLFeeder_C_Impl *)in_RDI);
    p_Var4 = pNVar2->FeedRowAndObjNames;
    pNVar2 = NLF((NLW2_NLFeeder_C_Impl *)in_RDI);
    (*p_Var4)(pNVar2->p_user_data_,puVar3);
    std::function<void_(const_char_*)>::~function((function<void_(const_char_*)> *)0x10dea6);
  }
  return;
}

Assistant:

void FeedRowAndObjNames(RowObjNameWriter& wrt) {
    assert(NLF().FeedRowAndObjNames);
    if (NLF().want_row_and_obj_names_ && wrt) {
      std::function<void(const char*)> wrt_c
          = [&wrt](const char* name) {
        wrt << name;
      };
      NLF().FeedRowAndObjNames(NLF().p_user_data_, &wrt_c);
    }
  }